

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O1

void setup_des_key(uchar *key_56,DES_key_schedule *ks)

{
  DES_cblock key;
  uchar local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  byte local_14;
  byte local_13;
  byte local_12;
  uchar local_11;
  
  local_17 = key_56[1] >> 1 | *key_56 << 7;
  local_18 = *key_56;
  local_16 = key_56[2] >> 2 | key_56[1] << 6;
  local_15 = key_56[3] >> 3 | key_56[2] << 5;
  local_14 = key_56[4] >> 4 | key_56[3] << 4;
  local_13 = key_56[5] >> 5 | key_56[4] << 3;
  local_12 = key_56[6] >> 6 | key_56[5] << 2;
  local_11 = key_56[6] * '\x02';
  DES_set_odd_parity((DES_cblock *)&local_18);
  DES_set_key_unchecked((const_DES_cblock *)&local_18,(DES_key_schedule *)ks);
  return;
}

Assistant:

static void setup_des_key(const unsigned char *key_56,
                          DES_key_schedule DESKEYARG(ks))
{
  DES_cblock key;

  /* Expand the 56-bit key to 64-bits */
  extend_key_56_to_64(key_56, (char *) &key);

  /* Set the key parity to odd */
  DES_set_odd_parity(&key);

  /* Set the key */
  DES_set_key_unchecked(&key, ks);
}